

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

SizeRange *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::SizeRange>::New(Arena *arena)

{
  Arena *arena_local;
  SizeRange *local_28;
  SizeRange *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (SizeRange *)operator_new(0x28);
    CoreML::Specification::SizeRange::SizeRange(local_28);
  }
  else {
    local_28 = (SizeRange *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::SizeRange::typeinfo,0x28);
    CoreML::Specification::SizeRange::SizeRange(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<CoreML::Specification::SizeRange>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }